

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::drawPoints(QPainter *this,QPointF *points,int pointCount)

{
  long lVar1;
  bool bVar2;
  TransformationType TVar3;
  PenCapStyle PVar4;
  QPainterPrivate *pQVar5;
  pointer pQVar6;
  pointer pQVar7;
  uint in_EDX;
  long in_RSI;
  long in_FS_OFFSET;
  qreal qVar8;
  qreal qVar9;
  double xpos;
  DrawOperation in_stack_00000024;
  QPainterPath *in_stack_00000028;
  QPainterPrivate *in_stack_00000030;
  int i_1;
  bool flat_pen;
  int i;
  QPainterPrivate *d;
  QPainterPath path;
  QPen pen;
  QPointF pt;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *in_stack_ffffffffffffff58;
  QPainterPrivate *in_stack_ffffffffffffff60;
  QTransform *in_stack_ffffffffffffff68;
  QMessageLogger *in_stack_ffffffffffffff70;
  QPainterPath *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar10;
  int local_6c;
  QPointF local_38;
  QPainter *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QPainter *)0x597c49);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x597c5f);
  if (bVar2) {
    if (0 < (int)in_EDX) {
      if (pQVar5->extended == (QPaintEngineEx *)0x0) {
        QPainterPrivate::updateState(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        pQVar6 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                           ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                            0x597cf0);
        if (pQVar6->emulationSpecifier == 0) {
          pQVar7 = std::unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>::
                   operator->((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)
                              0x597d0a);
          (*pQVar7->_vptr_QPaintEngine[0xc])(pQVar7,in_RSI,(ulong)in_EDX);
        }
        else {
          pQVar6 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                             ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)
                              0x597d2f);
          if (pQVar6->emulationSpecifier == 1) {
            std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                      ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x597d4a);
            TVar3 = QTransform::type(in_stack_ffffffffffffff68);
            if (TVar3 == TxTranslate) {
              for (local_6c = 0; local_6c < (int)in_EDX; local_6c = local_6c + 1) {
                local_38.xp = -NAN;
                local_38.yp = -NAN;
                qVar8 = QPointF::x((QPointF *)(in_RSI + (long)local_6c * 0x10));
                pQVar6 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::
                         operator->((unique_ptr<QPainterState,_std::default_delete<QPainterState>_>
                                     *)0x597dba);
                qVar9 = QTransform::dx(&pQVar6->matrix);
                xpos = qVar8 + qVar9;
                qVar8 = QPointF::y((QPointF *)(in_RSI + (long)local_6c * 0x10));
                pQVar6 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::
                         operator->((unique_ptr<QPainterState,_std::default_delete<QPainterState>_>
                                     *)0x597e06);
                qVar9 = QTransform::dy(&pQVar6->matrix);
                QPointF::QPointF(&local_38,xpos,qVar8 + qVar9);
                pQVar7 = std::unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>::
                         operator->((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>
                                     *)0x597e43);
                (*pQVar7->_vptr_QPaintEngine[0xc])(pQVar7,&local_38,1);
              }
              goto LAB_00597fe4;
            }
          }
          std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                    ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x597e85);
          QPen::QPen((QPen *)in_stack_ffffffffffffff60,(QPen *)in_stack_ffffffffffffff58);
          PVar4 = QPen::capStyle((QPen *)0x597ea0);
          if (PVar4 == FlatCap) {
            save((QPainter *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
            QPen::setCapStyle((QPen *)in_stack_ffffffffffffff70,
                              (PenCapStyle)((ulong)in_stack_ffffffffffffff68 >> 0x20));
            setPen((QPainter *)in_stack_ffffffffffffff68,(QPen *)in_stack_ffffffffffffff60);
          }
          QPainterPath::QPainterPath((QPainterPath *)0x597ef1);
          for (iVar10 = 0; iVar10 < (int)in_EDX; iVar10 = iVar10 + 1) {
            QPointF::x((QPointF *)(in_RSI + (long)iVar10 * 0x10));
            QPointF::y((QPointF *)(in_RSI + (long)iVar10 * 0x10));
            QPainterPath::moveTo
                      (in_stack_ffffffffffffff78,(qreal)in_stack_ffffffffffffff70,
                       (qreal)in_stack_ffffffffffffff68);
            QPointF::x((QPointF *)(in_RSI + (long)iVar10 * 0x10));
            QPointF::y((QPointF *)(in_RSI + (long)iVar10 * 0x10));
            QPainterPath::lineTo
                      (in_stack_ffffffffffffff78,(qreal)in_stack_ffffffffffffff70,
                       (qreal)in_stack_ffffffffffffff68);
          }
          QPainterPrivate::draw_helper(in_stack_00000030,in_stack_00000028,in_stack_00000024);
          if (PVar4 == FlatCap) {
            restore(in_stack_ffffffffffffffd8);
          }
          QPainterPath::~QPainterPath((QPainterPath *)0x597fda);
          QPen::~QPen((QPen *)0x597fe4);
        }
      }
      else {
        (*(pQVar5->extended->super_QPaintEngine)._vptr_QPaintEngine[0xc])
                  (pQVar5->extended,in_RSI,(ulong)in_EDX);
      }
    }
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
               (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(char *)in_stack_ffffffffffffff58);
    QMessageLogger::warning(&stack0xffffffffffffffd8,"QPainter::drawPoints: Painter not active");
  }
LAB_00597fe4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::drawPoints(const QPointF *points, int pointCount)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawPoints(), count=%d\n", pointCount);
#endif
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::drawPoints: Painter not active");
        return;
    }

    if (pointCount <= 0)
        return;

    if (d->extended) {
        d->extended->drawPoints(points, pointCount);
        return;
    }

    d->updateState(d->state);

    if (!d->state->emulationSpecifier) {
        d->engine->drawPoints(points, pointCount);
        return;
    }

    if (d->state->emulationSpecifier == QPaintEngine::PrimitiveTransform
        && d->state->matrix.type() == QTransform::TxTranslate) {
        // ### use drawPoints function
        for (int i=0; i<pointCount; ++i) {
            QPointF pt(points[i].x() + d->state->matrix.dx(),
                       points[i].y() + d->state->matrix.dy());
            d->engine->drawPoints(&pt, 1);
        }
    } else {
        QPen pen = d->state->pen;
        bool flat_pen = pen.capStyle() == Qt::FlatCap;
        if (flat_pen) {
            save();
            pen.setCapStyle(Qt::SquareCap);
            setPen(pen);
        }
        QPainterPath path;
        for (int i=0; i<pointCount; ++i) {
            path.moveTo(points[i].x(), points[i].y());
            path.lineTo(points[i].x() + 0.0001, points[i].y());
        }
        d->draw_helper(path, QPainterPrivate::StrokeDraw);
        if (flat_pen)
            restore();
    }
}